

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::VersionUpdate(CClient *this)

{
  int iVar1;
  long in_FS_OFFSET;
  CNetChunk Packet;
  CNetChunk local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (this->m_VersionInfo).m_State;
  if (iVar1 == 1) {
    if ((this->m_VersionInfo).m_VersionServeraddr.m_Job.m_Status == 2) {
      if ((this->m_VersionInfo).m_VersionServeraddr.m_Job.m_Result == 0) {
        mem_zero(&local_48,0x30);
        (this->m_VersionInfo).m_VersionServeraddr.m_Addr.port = 0x205d;
        local_48.m_ClientID = -1;
        local_48.m_Address.type = (this->m_VersionInfo).m_VersionServeraddr.m_Addr.type;
        local_48.m_Address.ip[0] = (this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[0];
        local_48.m_Address.ip[1] = (this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[1];
        local_48.m_Address.ip[2] = (this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[2];
        local_48.m_Address.ip[3] = (this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip[3];
        local_48.m_Address.ip._4_8_ =
             *(undefined8 *)((this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip + 4);
        local_48.m_Address._16_8_ =
             *(undefined8 *)((this->m_VersionInfo).m_VersionServeraddr.m_Addr.ip + 0xc);
        local_48.m_pData = VERSIONSRV_GETVERSION;
        local_48.m_Flags = 2;
        local_48.m_DataSize = 8;
        CNetClient::Send(&this->m_ContactClient,&local_48,0xffffffff,(CSendCBData *)0x0);
        (this->m_VersionInfo).m_State = 2;
      }
      else {
        (this->m_VersionInfo).m_State = 3;
      }
    }
  }
  else if (iVar1 == 0) {
    (*(this->m_pEngine->super_IInterface)._vptr_IInterface[6])
              (this->m_pEngine,&(this->m_VersionInfo).m_VersionServeraddr,
               this->m_pConfig->m_ClVersionServer,
               (ulong)(uint)(this->m_ContactClient).super_CNetBase.m_Socket.type);
    (this->m_VersionInfo).m_State = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::VersionUpdate()
{
	if(m_VersionInfo.m_State == CVersionInfo::STATE_INIT)
	{
		Engine()->HostLookup(&m_VersionInfo.m_VersionServeraddr, Config()->m_ClVersionServer, m_ContactClient.NetType());
		m_VersionInfo.m_State = CVersionInfo::STATE_START;
	}
	else if(m_VersionInfo.m_State == CVersionInfo::STATE_START)
	{
		if(m_VersionInfo.m_VersionServeraddr.m_Job.Status() == CJob::STATE_DONE)
		{
			if(m_VersionInfo.m_VersionServeraddr.m_Job.Result() == 0)
			{
				CNetChunk Packet;

				mem_zero(&Packet, sizeof(Packet));

				m_VersionInfo.m_VersionServeraddr.m_Addr.port = VERSIONSRV_PORT;

				Packet.m_ClientID = -1;
				Packet.m_Address = m_VersionInfo.m_VersionServeraddr.m_Addr;
				Packet.m_pData = VERSIONSRV_GETVERSION;
				Packet.m_DataSize = sizeof(VERSIONSRV_GETVERSION);
				Packet.m_Flags = NETSENDFLAG_CONNLESS;

				m_ContactClient.Send(&Packet);
				m_VersionInfo.m_State = CVersionInfo::STATE_READY;
			}
			else
				m_VersionInfo.m_State = CVersionInfo::STATE_ERROR;
		}
	}
}